

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int DisconnectRazorAHRSx(RAZORAHRS *pRazorAHRS)

{
  int iVar1;
  char *__s;
  long lVar2;
  
  lVar2 = 0;
  while ((RAZORAHRS *)addrsRazorAHRS[lVar2] != pRazorAHRS) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x10) {
      return 1;
    }
  }
  iVar1 = CloseRS232Port(&pRazorAHRS->RS232Port);
  __s = "RazorAHRS disconnection failed.";
  if (iVar1 == 0) {
    __s = "RazorAHRS disconnected.";
  }
  puts(__s);
  if (iVar1 != 0) {
    return 1;
  }
  addrsRazorAHRS[lVar2] = (void *)0x0;
  return 0;
}

Assistant:

HARDWAREX_API int DisconnectRazorAHRSx(RAZORAHRS* pRazorAHRS)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRazorAHRS[id] != pRazorAHRS)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectRazorAHRS(pRazorAHRS);
	if (res != EXIT_SUCCESS) return res;

	addrsRazorAHRS[id] = NULL;

	return EXIT_SUCCESS;
}